

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O0

void Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
               (ImageTemplate<unsigned_char> *image1,ImageTemplate<unsigned_char> *image2)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  ImageTemplate<unsigned_char> *in_RSI;
  ImageTemplate<unsigned_char> *in_RDI;
  imageException *unaff_retaddr;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffd0;
  
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_RDI);
  if ((((!bVar1) && (bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_RSI), !bVar1))
      && (bVar1 = IsCorrectColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                            (in_stack_ffffffffffffffd0), bVar1)) &&
     (bVar1 = IsCorrectColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                        (in_stack_ffffffffffffffd0), bVar1)) {
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI);
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RSI);
    if (uVar2 == uVar3) {
      uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI);
      uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RSI);
      if (uVar2 == uVar3) {
        return;
      }
    }
  }
  uVar4 = __cxa_allocate_exception(0x28);
  imageException::imageException(unaff_retaddr,(char *)in_RDI);
  __cxa_throw(uVar4,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ParameterValidation( const TImage & image1, const TImage & image2 )
    {
        if( image1.empty() || image2.empty() || !IsCorrectColorCount( image1 ) || !IsCorrectColorCount( image2 ) ||
            image1.width() != image2.width() || image1.height() != image2.height() )
            throw imageException( "Bad input parameters in image function" );
    }